

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

void rtcAttachGeometryByID(RTCScene hscene,RTCGeometry hgeometry,uint geomID)

{
  undefined8 *puVar1;
  socklen_t in_ECX;
  allocator local_59;
  DeviceEnterLeave enterleave;
  RTCGeometry local_50;
  string local_48 [32];
  
  if (hscene == (RTCScene)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_48,"invalid argument",(allocator *)&enterleave);
    *puVar1 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar1 + 1) = 2;
    std::__cxx11::string::string((string *)(puVar1 + 2),local_48);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  if (hgeometry == (RTCGeometry)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_48,"invalid argument",(allocator *)&enterleave);
    *puVar1 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar1 + 1) = 2;
    std::__cxx11::string::string((string *)(puVar1 + 2),local_48);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  if (geomID == 0xffffffff) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_48,"invalid argument",(allocator *)&enterleave);
    *puVar1 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar1 + 1) = 2;
    std::__cxx11::string::string((string *)(puVar1 + 2),local_48);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  embree::DeviceEnterLeave::DeviceEnterLeave(&enterleave,hscene);
  if (*(long *)(hscene + 0x188) == *(long *)(hgeometry + 0x10)) {
    local_50 = hgeometry;
    (**(code **)(*(long *)hgeometry + 0x10))(hgeometry);
    embree::Scene::bind((Scene *)hscene,geomID,(sockaddr *)&local_50,in_ECX);
    if (local_50 != (RTCGeometry)0x0) {
      (**(code **)(*(long *)local_50 + 0x18))();
    }
    embree::DeviceEnterLeave::~DeviceEnterLeave(&enterleave);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_48,"inputs are from different devices",&local_59);
  *puVar1 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar1 + 1) = 2;
  std::__cxx11::string::string((string *)(puVar1 + 2),local_48);
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcAttachGeometryByID (RTCScene hscene, RTCGeometry hgeometry, unsigned int geomID)
  {
    Scene* scene = (Scene*) hscene;
    Geometry* geometry = (Geometry*) hgeometry;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcAttachGeometryByID);
    RTC_VERIFY_HANDLE(hscene);
    RTC_VERIFY_HANDLE(hgeometry);
    RTC_VERIFY_GEOMID(geomID);
    RTC_ENTER_DEVICE(hscene);
    if (scene->device != geometry->device)
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"inputs are from different devices");
    scene->bind(geomID,geometry);
    RTC_CATCH_END2(scene);
  }